

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_resources(Compiler *compiler,ShaderResources *res)

{
  FILE *__stream;
  undefined8 uVar1;
  char *pcVar2;
  anon_class_8_1_c430121d local_1b0 [3];
  EntryPoint *local_198;
  EntryPoint *e;
  EntryPoint *__end1;
  EntryPoint *__begin1;
  SmallVector<spirv_cross::EntryPoint,_8UL> *__range1;
  SmallVector<spirv_cross::EntryPoint,_8UL> entry_points;
  Bitset *modes;
  ShaderResources *res_local;
  Compiler *compiler_local;
  
  entry_points.stack_storage.aligned_char._312_8_ =
       spirv_cross::Compiler::get_execution_mode_bitset(compiler);
  fprintf(_stderr,"Entry points:\n");
  spirv_cross::Compiler::get_entry_points_and_stages
            ((SmallVector<spirv_cross::EntryPoint,_8UL> *)&__range1,compiler);
  __begin1 = (EntryPoint *)&__range1;
  __end1 = spirv_cross::VectorView<spirv_cross::EntryPoint>::begin
                     ((VectorView<spirv_cross::EntryPoint> *)__begin1);
  e = spirv_cross::VectorView<spirv_cross::EntryPoint>::end
                ((VectorView<spirv_cross::EntryPoint> *)__begin1);
  for (; __stream = _stderr, __end1 != e; __end1 = __end1 + 1) {
    local_198 = __end1;
    uVar1 = std::__cxx11::string::c_str();
    pcVar2 = execution_model_to_str(local_198->execution_model);
    fprintf(__stream,"  %s (%s)\n",uVar1,pcVar2);
  }
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Execution modes:\n");
  local_1b0[0].compiler = compiler;
  spirv_cross::Bitset::
  for_each_bit<print_resources(spirv_cross::Compiler_const&,spirv_cross::ShaderResources_const&)::__0>
            ((Bitset *)entry_points.stack_storage.aligned_char._312_8_,local_1b0);
  fprintf(_stderr,"\n");
  print_resources(compiler,"subpass inputs",&res->subpass_inputs);
  print_resources(compiler,"inputs",&res->stage_inputs);
  print_resources(compiler,"outputs",&res->stage_outputs);
  print_resources(compiler,"textures",&res->sampled_images);
  print_resources(compiler,"separate images",&res->separate_images);
  print_resources(compiler,"separate samplers",&res->separate_samplers);
  print_resources(compiler,"images",&res->storage_images);
  print_resources(compiler,"ssbos",&res->storage_buffers);
  print_resources(compiler,"ubos",&res->uniform_buffers);
  print_resources(compiler,"push",&res->push_constant_buffers);
  print_resources(compiler,"counters",&res->atomic_counters);
  print_resources(compiler,"acceleration structures",&res->acceleration_structures);
  spirv_cross::SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector
            ((SmallVector<spirv_cross::EntryPoint,_8UL> *)&__range1);
  return;
}

Assistant:

static void print_resources(const Compiler &compiler, const ShaderResources &res)
{
	auto &modes = compiler.get_execution_mode_bitset();

	fprintf(stderr, "Entry points:\n");
	auto entry_points = compiler.get_entry_points_and_stages();
	for (auto &e : entry_points)
		fprintf(stderr, "  %s (%s)\n", e.name.c_str(), execution_model_to_str(e.execution_model));
	fprintf(stderr, "\n");

	fprintf(stderr, "Execution modes:\n");
	modes.for_each_bit([&](uint32_t i) {
		auto mode = static_cast<ExecutionMode>(i);
		uint32_t arg0 = compiler.get_execution_mode_argument(mode, 0);
		uint32_t arg1 = compiler.get_execution_mode_argument(mode, 1);
		uint32_t arg2 = compiler.get_execution_mode_argument(mode, 2);

		switch (static_cast<ExecutionMode>(i))
		{
		case ExecutionModeInvocations:
			fprintf(stderr, "  Invocations: %u\n", arg0);
			break;

		case ExecutionModeLocalSize:
			fprintf(stderr, "  LocalSize: (%u, %u, %u)\n", arg0, arg1, arg2);
			break;

		case ExecutionModeOutputVertices:
			fprintf(stderr, "  OutputVertices: %u\n", arg0);
			break;

#define CHECK_MODE(m)                  \
	case ExecutionMode##m:             \
		fprintf(stderr, "  %s\n", #m); \
		break
			CHECK_MODE(SpacingEqual);
			CHECK_MODE(SpacingFractionalEven);
			CHECK_MODE(SpacingFractionalOdd);
			CHECK_MODE(VertexOrderCw);
			CHECK_MODE(VertexOrderCcw);
			CHECK_MODE(PixelCenterInteger);
			CHECK_MODE(OriginUpperLeft);
			CHECK_MODE(OriginLowerLeft);
			CHECK_MODE(EarlyFragmentTests);
			CHECK_MODE(PointMode);
			CHECK_MODE(Xfb);
			CHECK_MODE(DepthReplacing);
			CHECK_MODE(DepthGreater);
			CHECK_MODE(DepthLess);
			CHECK_MODE(DepthUnchanged);
			CHECK_MODE(LocalSizeHint);
			CHECK_MODE(InputPoints);
			CHECK_MODE(InputLines);
			CHECK_MODE(InputLinesAdjacency);
			CHECK_MODE(Triangles);
			CHECK_MODE(InputTrianglesAdjacency);
			CHECK_MODE(Quads);
			CHECK_MODE(Isolines);
			CHECK_MODE(OutputPoints);
			CHECK_MODE(OutputLineStrip);
			CHECK_MODE(OutputTriangleStrip);
			CHECK_MODE(VecTypeHint);
			CHECK_MODE(ContractionOff);

		default:
			break;
		}
	});
	fprintf(stderr, "\n");

	print_resources(compiler, "subpass inputs", res.subpass_inputs);
	print_resources(compiler, "inputs", res.stage_inputs);
	print_resources(compiler, "outputs", res.stage_outputs);
	print_resources(compiler, "textures", res.sampled_images);
	print_resources(compiler, "separate images", res.separate_images);
	print_resources(compiler, "separate samplers", res.separate_samplers);
	print_resources(compiler, "images", res.storage_images);
	print_resources(compiler, "ssbos", res.storage_buffers);
	print_resources(compiler, "ubos", res.uniform_buffers);
	print_resources(compiler, "push", res.push_constant_buffers);
	print_resources(compiler, "counters", res.atomic_counters);
	print_resources(compiler, "acceleration structures", res.acceleration_structures);
}